

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O2

int owner_parse(char *spec,cpio_owner *owner,char **errmsg)

{
  byte bVar1;
  group *pgVar2;
  char *__name;
  passwd *ppVar3;
  int *piVar4;
  ulong uVar5;
  char *pcVar6;
  size_t __n;
  char *end;
  
  owner->uid = -1;
  owner->gid = -1;
  owner->uname = (char *)0x0;
  owner->gname = (char *)0x0;
  bVar1 = *spec;
  if (bVar1 == 0) {
    pcVar6 = "Invalid empty user/group spec";
    goto LAB_001096a5;
  }
  if ((bVar1 == 0x2e) || (bVar1 == 0x3a)) {
    pcVar6 = spec + 1;
LAB_001094b9:
    if (*pcVar6 == '\0') {
      return 0;
    }
    pgVar2 = getgrnam(pcVar6);
    if (pgVar2 == (group *)0x0) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      uVar5 = strtoul(pcVar6,&end,10);
      owner->gid = (int)uVar5;
      if ((*piVar4 == 0) && (*end == '\0')) {
        return 0;
      }
      snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",pcVar6);
      owner_parse::errbuff[0x7f] = '\0';
      *errmsg = owner_parse::errbuff;
      return -1;
    }
    owner->gid = pgVar2->gr_gid;
    pcVar6 = strdup(pgVar2->gr_name);
    owner->gname = pcVar6;
    if (pcVar6 != (char *)0x0) {
      return 0;
    }
    free(owner->uname);
    owner->uname = (char *)0x0;
  }
  else {
    __n = 0;
    while ((0x3a < bVar1 || ((0x400400000000001U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
      bVar1 = spec[__n + 1];
      __n = __n + 1;
    }
    __name = (char *)malloc(__n + 1);
    if (__name != (char *)0x0) {
      memcpy(__name,spec,__n);
      __name[__n] = '\0';
      ppVar3 = getpwnam(__name);
      if (ppVar3 == (passwd *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtoul(__name,&end,10);
        owner->uid = (int)uVar5;
        if ((*piVar4 != 0) || (*end != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'",__name);
          owner_parse::errbuff[0x7f] = '\0';
          free(__name);
          *errmsg = owner_parse::errbuff;
          return -1;
        }
      }
      else {
        owner->uid = ppVar3->pw_uid;
        pcVar6 = strdup(ppVar3->pw_name);
        owner->uname = pcVar6;
        if (pcVar6 == (char *)0x0) {
          free(__name);
          goto LAB_0010969e;
        }
        if (spec[__n] != '\0') {
          owner->gid = ppVar3->pw_gid;
        }
      }
      pcVar6 = spec + __n + (bVar1 != 0);
      free(__name);
      goto LAB_001094b9;
    }
  }
LAB_0010969e:
  pcVar6 = "Couldn\'t allocate memory";
LAB_001096a5:
  *errmsg = pcVar6;
  return -1;
}

Assistant:

int
owner_parse(const char *spec, struct cpio_owner *owner, const char **errmsg)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	owner->uid = -1;
	owner->gid = -1;

	owner->uname = NULL;
	owner->gname = NULL;

	if (spec[0] == '\0') {
		*errmsg = "Invalid empty user/group spec";
		return (-1);
	}

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = malloc(ue - u + 1);
		if (user == NULL)
			goto alloc_error;
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			owner->uid = pwent->pw_uid;
			owner->uname = strdup(pwent->pw_name);
			if (owner->uname == NULL) {
				free(user);
				goto alloc_error;
			}
			if (*ue != '\0')
				owner->gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			owner->uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				*errmsg = errbuff;
				return (-1);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			owner->gid = grp->gr_gid;
			owner->gname = strdup(grp->gr_name);
			if (owner->gname == NULL) {
				free(owner->uname);
				owner->uname = NULL;
				goto alloc_error;
			}
		} else {
			char *end;
			errno = 0;
			owner->gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				*errmsg = errbuff;
				return (-1);
			}
		}
	}
	return (0);
alloc_error:
	*errmsg = "Couldn't allocate memory";
	return (-1);
}